

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_tlm.cpp
# Opt level: O2

void __thiscall
CmdTlm::blobs(CmdTlm *this,vector<Commands::Blob,_std::allocator<Commands::Blob>_> *blobs)

{
  long lVar1;
  PacketWriter *pPVar2;
  long lVar3;
  pointer pBVar4;
  Blob *blob;
  pointer pBVar5;
  undefined1 local_3b;
  undefined2 local_3a;
  CmdTlm *local_38;
  
  pPVar2 = this->packetWriter;
  lVar3 = *(long *)((long)*pPVar2 + -0x20);
  lVar1 = (long)&pPVar2->field_0x0 + lVar3;
  local_3b = 4;
  local_38 = this;
  (*(code *)**(undefined8 **)((long)&pPVar2->field_0x0 + lVar3))(lVar1,&local_3b,1);
  local_3a = (undefined2)
             (((long)(blobs->super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(blobs->super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>).
                    _M_impl.super__Vector_impl_data._M_start) / 0xc);
  (*(code *)**(undefined8 **)((long)&pPVar2->field_0x0 + lVar3))(lVar1,&local_3a,2);
  pBVar5 = (blobs->super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar4 = (blobs->super__Vector_base<Commands::Blob,_std::allocator<Commands::Blob>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    pPVar2 = local_38->packetWriter;
    if (pBVar5 == pBVar4) break;
    lVar3 = *(long *)((long)*pPVar2 + -0x20);
    lVar1 = (long)&pPVar2->field_0x0 + lVar3;
    (*(code *)**(undefined8 **)((long)&pPVar2->field_0x0 + lVar3))(lVar1,pBVar5,4);
    (*(code *)**(undefined8 **)((long)&pPVar2->field_0x0 + lVar3))(lVar1,&pBVar5->y,4);
    (*(code *)**(undefined8 **)((long)&pPVar2->field_0x0 + lVar3))(lVar1,&pBVar5->size,4);
    pBVar5 = pBVar5 + 1;
  }
  (**(code **)((long)*pPVar2 + 8))(pPVar2);
  return;
}

Assistant:

void  CmdTlm::blobs(vector<Blob> & blobs) {
  *packetWriter << (uint8_t) 4 << (uint16_t) blobs.size();
  for (Blob &blob : blobs) {
    *packetWriter << blob.x << blob.y << blob.size;
  }
  packetWriter->write_packet();
}